

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

void __thiscall
SQCompilation::CheckerVisitor::checkVariableMismatchForLoop(CheckerVisitor *this,ForStatement *loop)

{
  Node *n;
  Node *n_00;
  _func_int **__s2;
  _func_int **pp_Var1;
  long lVar2;
  int iVar3;
  TreeOp TVar4;
  Node *pNVar5;
  BinExpr *bin;
  
  if (this->effectsOnly != false) {
    return;
  }
  pNVar5 = loop->_init;
  if (pNVar5 == (Node *)0x0) {
    return;
  }
  n = &loop->_cond->super_Node;
  n_00 = &loop->_mod->super_Node;
  if (pNVar5->_op != TO_VAR) {
    if (pNVar5->_op != TO_ASSIGN) {
      return;
    }
    pNVar5 = (Node *)pNVar5[1].super_ArenaObj._vptr_ArenaObj;
    if (pNVar5->_op != TO_ID) {
      return;
    }
  }
  __s2 = pNVar5[1].super_ArenaObj._vptr_ArenaObj;
  if ((((n != (Node *)0x0) && (__s2 != (_func_int **)0x0)) && (n->_op - TO_OROR < 0x16)) &&
     (pp_Var1 = n[1].super_ArenaObj._vptr_ArenaObj, *(int *)(pp_Var1 + 3) == 0x11)) {
    lVar2 = *(long *)&n[1]._coordinates;
    iVar3 = strcmp((char *)pp_Var1[4],(char *)__s2);
    if ((iVar3 != 0) &&
       ((*(int *)(lVar2 + 0x18) != 0x11 ||
        (iVar3 = strcmp(*(char **)(lVar2 + 0x20),(char *)__s2), iVar3 != 0)))) {
      report(this,n,0x75);
    }
  }
  if (n_00 == (Node *)0x0) {
    return;
  }
  if (__s2 == (_func_int **)0x0) {
    return;
  }
  TVar4 = n_00->_op;
  if (((ulong)TVar4 < 0x31) && ((0x1f00000100000U >> ((ulong)TVar4 & 0x3f) & 1) != 0)) {
    pp_Var1 = n_00[1].super_ArenaObj._vptr_ArenaObj;
    if (*(int *)(pp_Var1 + 3) != 0x11) {
      return;
    }
    iVar3 = strcmp((char *)__s2,(char *)pp_Var1[4]);
    if (iVar3 == 0) {
      return;
    }
    report(this,n_00,0x75);
    TVar4 = n_00->_op;
  }
  if (((TVar4 == TO_INC) && (*(int *)(*(long *)&n_00[1]._coordinates + 0x18) == 0x11)) &&
     (iVar3 = strcmp((char *)__s2,*(char **)(*(long *)&n_00[1]._coordinates + 0x20)), iVar3 != 0)) {
    report(this,n_00,0x75);
    return;
  }
  return;
}

Assistant:

void CheckerVisitor::checkVariableMismatchForLoop(ForStatement *loop) {

  if (effectsOnly)
    return;

  const SQChar *varname = nullptr;
  Node *init = loop->initializer();
  Expr *cond = loop->condition();
  Expr *mod = loop->modifier();

  if (init) {
    if (init->op() == TO_ASSIGN) {
      Expr *l = static_cast<BinExpr *>(init)->lhs();
      if (l->op() == TO_ID)
        varname = l->asId()->id();
    }

    if (init->op() == TO_VAR) {
      VarDecl *decl = static_cast<VarDecl *>(init);
      varname = decl->name();
    }
  }

  if (varname && cond) {
    if (isBinaryArith(cond)) {
      BinExpr *bin = static_cast<BinExpr *>(cond);
      Expr *l = bin->lhs();
      Expr *r = bin->rhs();

      if (l->op() == TO_ID) {
        if (strcmp(l->asId()->id(), varname) != 0) {
          if (r->op() != TO_ID || (strcmp(r->asId()->id(), varname) != 0)) {
            report(cond, DiagnosticsId::DI_MISMATCH_LOOP_VAR);
          }
        }
      }
    }
  }

  if (varname && mod) {
    if (isAssignExpr(mod)) {
      Expr *lhs = static_cast<BinExpr *>(mod)->lhs();
      if (lhs->op() == TO_ID) {
        if (strcmp(varname, lhs->asId()->id()) != 0) {
          report(mod, DiagnosticsId::DI_MISMATCH_LOOP_VAR);
        }
      }
    }

    if (mod->op() == TO_INC) {
      Expr *arg = static_cast<IncExpr *>(mod)->argument();
      if (arg->op() == TO_ID) {
        if (strcmp(varname, arg->asId()->id()) != 0) {
          report(mod, DiagnosticsId::DI_MISMATCH_LOOP_VAR);
        }
      }
    }
  }
}